

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  RayK<8> *pRVar27;
  byte bVar28;
  byte bVar29;
  int iVar30;
  ulong uVar31;
  byte bVar32;
  undefined1 (*pauVar33) [32];
  ulong uVar34;
  byte bVar35;
  undefined4 uVar36;
  ulong uVar37;
  NodeRef root;
  long lVar38;
  ulong uVar39;
  ulong *puVar40;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar79 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5cb9;
  size_t local_5cb8;
  RayK<8> *local_5cb0;
  BVH *local_5ca8;
  Intersectors *local_5ca0;
  RayQueryContext *local_5c98;
  RayK<8> *local_5c90;
  ulong local_5c88;
  undefined1 local_5c80 [32];
  ulong local_5c58;
  RTCFilterFunctionNArguments local_5c50;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5ca8 = (BVH *)This->ptr;
  if ((local_5ca8->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar43 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar75 = ZEXT816(0) << 0x40;
      uVar42 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar75),5);
      uVar39 = vpcmpeqd_avx512vl(auVar43,(undefined1  [32])valid_i->field_0);
      uVar42 = uVar42 & uVar39;
      bVar29 = (byte)uVar42;
      if (bVar29 != 0) {
        local_5be0._0_8_ = *(undefined8 *)ray;
        local_5be0._8_8_ = *(undefined8 *)(ray + 8);
        local_5be0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5be0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5be0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5be0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5be0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5be0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5be0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5be0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5be0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5be0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar83 = ZEXT3264(auVar43);
        vandps_avx512vl(local_5b80,auVar43);
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        auVar84 = ZEXT3264(auVar44);
        uVar39 = vcmpps_avx512vl(auVar43,auVar44,1);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar85 = ZEXT3264(auVar45);
        auVar46 = vdivps_avx512vl(auVar45,local_5b80);
        vandps_avx512vl(local_5b60,auVar43);
        uVar37 = vcmpps_avx512vl(auVar46,auVar44,1);
        auVar47 = vdivps_avx512vl(auVar45,local_5b60);
        vandps_avx512vl(local_5b40,auVar43);
        uVar31 = vcmpps_avx512vl(auVar47,auVar44,1);
        auVar43 = vdivps_avx512vl(auVar45,local_5b40);
        auVar77 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar41 = (bool)((byte)uVar39 & 1);
        local_5b20._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._0_4_;
        bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._4_4_;
        bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
        fStack_5b18 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._8_4_);
        bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
        fStack_5b14 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._12_4_);
        bVar41 = (bool)((byte)(uVar39 >> 4) & 1);
        fStack_5b10 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._16_4_);
        bVar41 = (bool)((byte)(uVar39 >> 5) & 1);
        fStack_5b0c = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._20_4_);
        bVar41 = (bool)((byte)(uVar39 >> 6) & 1);
        fStack_5b08 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._24_4_);
        bVar41 = SUB81(uVar39 >> 7,0);
        register0x00000918 = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar46._28_4_;
        bVar41 = (bool)((byte)uVar37 & 1);
        local_5b00._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._0_4_;
        bVar41 = (bool)((byte)(uVar37 >> 1) & 1);
        local_5b00._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._4_4_;
        bVar41 = (bool)((byte)(uVar37 >> 2) & 1);
        fStack_5af8 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._8_4_);
        bVar41 = (bool)((byte)(uVar37 >> 3) & 1);
        fStack_5af4 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._12_4_);
        bVar41 = (bool)((byte)(uVar37 >> 4) & 1);
        fStack_5af0 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._16_4_);
        bVar41 = (bool)((byte)(uVar37 >> 5) & 1);
        fStack_5aec = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._20_4_);
        bVar41 = (bool)((byte)(uVar37 >> 6) & 1);
        fStack_5ae8 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._24_4_);
        bVar41 = SUB81(uVar37 >> 7,0);
        register0x00000918 = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._28_4_;
        bVar41 = (bool)((byte)uVar31 & 1);
        local_5ae0._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._0_4_;
        bVar41 = (bool)((byte)(uVar31 >> 1) & 1);
        local_5ae0._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._4_4_;
        bVar41 = (bool)((byte)(uVar31 >> 2) & 1);
        fStack_5ad8 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._8_4_);
        bVar41 = (bool)((byte)(uVar31 >> 3) & 1);
        fStack_5ad4 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._12_4_);
        bVar41 = (bool)((byte)(uVar31 >> 4) & 1);
        fStack_5ad0 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._16_4_);
        bVar41 = (bool)((byte)(uVar31 >> 5) & 1);
        fStack_5acc = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._20_4_);
        bVar41 = (bool)((byte)(uVar31 >> 6) & 1);
        fStack_5ac8 = (float)((uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._24_4_);
        bVar41 = SUB81(uVar31 >> 7,0);
        register0x00000918 = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar43._28_4_;
        uVar39 = vcmpps_avx512vl(_local_5b20,ZEXT1632(auVar75),1);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5ac0 = (uint)((byte)uVar39 & 1) * auVar43._0_4_;
        iStack_5abc = (uint)((byte)(uVar39 >> 1) & 1) * auVar43._4_4_;
        iStack_5ab8 = (uint)((byte)(uVar39 >> 2) & 1) * auVar43._8_4_;
        iStack_5ab4 = (uint)((byte)(uVar39 >> 3) & 1) * auVar43._12_4_;
        iStack_5ab0 = (uint)((byte)(uVar39 >> 4) & 1) * auVar43._16_4_;
        iStack_5aac = (uint)((byte)(uVar39 >> 5) & 1) * auVar43._20_4_;
        iStack_5aa8 = (uint)((byte)(uVar39 >> 6) & 1) * auVar43._24_4_;
        iStack_5aa4 = (uint)(byte)(uVar39 >> 7) * auVar43._28_4_;
        auVar44 = ZEXT1632(auVar75);
        uVar39 = vcmpps_avx512vl(_local_5b00,auVar44,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar41 = (bool)((byte)uVar39 & 1);
        local_5aa0 = (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
        uStack_5a9c = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
        uStack_5a98 = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
        uStack_5a94 = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 4) & 1);
        uStack_5a90 = (uint)bVar41 * auVar43._16_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 5) & 1);
        uStack_5a8c = (uint)bVar41 * auVar43._20_4_ | (uint)!bVar41 * 0x60;
        bVar41 = (bool)((byte)(uVar39 >> 6) & 1);
        uStack_5a88 = (uint)bVar41 * auVar43._24_4_ | (uint)!bVar41 * 0x60;
        bVar41 = SUB81(uVar39 >> 7,0);
        uStack_5a84 = (uint)bVar41 * auVar43._28_4_ | (uint)!bVar41 * 0x60;
        uVar39 = vcmpps_avx512vl(_local_5ae0,auVar44,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar41 = (bool)((byte)uVar39 & 1);
        local_5a80 = (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
        uStack_5a7c = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
        uStack_5a78 = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
        uStack_5a74 = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 4) & 1);
        uStack_5a70 = (uint)bVar41 * auVar43._16_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 5) & 1);
        uStack_5a6c = (uint)bVar41 * auVar43._20_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = (bool)((byte)(uVar39 >> 6) & 1);
        uStack_5a68 = (uint)bVar41 * auVar43._24_4_ | (uint)!bVar41 * 0xa0;
        bVar41 = SUB81(uVar39 >> 7,0);
        uStack_5a64 = (uint)bVar41 * auVar43._28_4_ | (uint)!bVar41 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar87 = ZEXT3264(local_4680);
        auVar43 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar44);
        local_5a60._0_4_ =
             (uint)(bVar29 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar29 & 1) * local_4680._0_4_;
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        local_5a60._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * local_4680._4_4_;
        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
        local_5a60._8_4_ = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * local_4680._8_4_;
        bVar41 = (bool)((byte)(uVar42 >> 3) & 1);
        local_5a60._12_4_ = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * local_4680._12_4_;
        bVar41 = (bool)((byte)(uVar42 >> 4) & 1);
        local_5a60._16_4_ = (uint)bVar41 * auVar43._16_4_ | (uint)!bVar41 * local_4680._16_4_;
        bVar41 = (bool)((byte)(uVar42 >> 5) & 1);
        local_5a60._20_4_ = (uint)bVar41 * auVar43._20_4_ | (uint)!bVar41 * local_4680._20_4_;
        bVar41 = (bool)((byte)(uVar42 >> 6) & 1);
        local_5a60._24_4_ = (uint)bVar41 * auVar43._24_4_ | (uint)!bVar41 * local_4680._24_4_;
        bVar41 = SUB81(uVar42 >> 7,0);
        local_5a60._28_4_ = (uint)bVar41 * auVar43._28_4_ | (uint)!bVar41 * local_4680._28_4_;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar86 = ZEXT3264(auVar43);
        auVar44 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar44);
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar42 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar42 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar42 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar42 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar42 >> 6) & 1);
        bVar9 = SUB81(uVar42 >> 7,0);
        local_5a40._4_4_ = (uint)bVar41 * auVar44._4_4_ | (uint)!bVar41 * auVar43._4_4_;
        local_5a40._0_4_ =
             (uint)(bVar29 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar43._0_4_;
        local_5a40._8_4_ = (uint)bVar4 * auVar44._8_4_ | (uint)!bVar4 * auVar43._8_4_;
        local_5a40._12_4_ = (uint)bVar5 * auVar44._12_4_ | (uint)!bVar5 * auVar43._12_4_;
        local_5a40._16_4_ = (uint)bVar6 * auVar44._16_4_ | (uint)!bVar6 * auVar43._16_4_;
        local_5a40._20_4_ = (uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * auVar43._20_4_;
        local_5a40._24_4_ = (uint)bVar8 * auVar44._24_4_ | (uint)!bVar8 * auVar43._24_4_;
        local_5a40._28_4_ = (uint)bVar9 * auVar44._28_4_ | (uint)!bVar9 * auVar43._28_4_;
        bVar29 = ~bVar29;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar39 = 7;
        }
        else {
          uVar39 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5c90 = ray + 0x100;
        puVar40 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar33 = (undefined1 (*) [32])local_4640;
        local_5808 = (local_5ca8->root).ptr;
        local_4660 = local_5a60;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar88 = ZEXT3264(auVar43);
        auVar81 = ZEXT3264(CONCAT428(0x3f800003,
                                     CONCAT424(0x3f800003,
                                               CONCAT420(0x3f800003,
                                                         CONCAT416(0x3f800003,
                                                                   CONCAT412(0x3f800003,
                                                                             CONCAT48(0x3f800003,
                                                                                                                                                                            
                                                  0x3f8000033f800003)))))));
        local_5ca0 = This;
        local_5c98 = context;
        local_5c88 = uVar39;
LAB_008738cb:
        pauVar33 = pauVar33 + -1;
        root.ptr = puVar40[-1];
        puVar40 = puVar40 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_00874261;
        auVar43 = *pauVar33;
        uVar37 = vcmpps_avx512vl(auVar43,local_5a40,1);
        if ((char)uVar37 == '\0') {
LAB_00874272:
          iVar30 = 2;
        }
        else {
          uVar36 = (undefined4)uVar37;
          iVar30 = 0;
          pRVar27 = ray;
          if ((uint)POPCOUNT(uVar36) <= uVar39) {
            do {
              local_5c80 = auVar43;
              local_5cb0 = pRVar27;
              local_5cb8 = 0;
              for (uVar39 = uVar37; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                local_5cb8 = local_5cb8 + 1;
              }
              auVar77 = ZEXT1664(auVar77._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar41 = occluded1(local_5ca0,local_5ca8,root,local_5cb8,&local_5cb9,local_5cb0,
                                 (TravRayK<8,_true> *)&local_5be0.field_0,local_5c98);
              bVar28 = (byte)(1 << ((uint)local_5cb8 & 0x1f));
              if (!bVar41) {
                bVar28 = 0;
              }
              bVar29 = bVar29 | bVar28;
              uVar37 = uVar37 - 1 & uVar37;
              pRVar27 = local_5cb0;
              auVar43 = local_5c80;
            } while (uVar37 != 0);
            if (bVar29 == 0xff) {
              iVar30 = 3;
            }
            else {
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5a40._0_4_ =
                   (uint)(bVar29 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar29 & 1) * local_5a40._0_4_
              ;
              bVar41 = (bool)(bVar29 >> 1 & 1);
              local_5a40._4_4_ = (uint)bVar41 * auVar44._4_4_ | (uint)!bVar41 * local_5a40._4_4_;
              bVar41 = (bool)(bVar29 >> 2 & 1);
              local_5a40._8_4_ = (uint)bVar41 * auVar44._8_4_ | (uint)!bVar41 * local_5a40._8_4_;
              bVar41 = (bool)(bVar29 >> 3 & 1);
              local_5a40._12_4_ = (uint)bVar41 * auVar44._12_4_ | (uint)!bVar41 * local_5a40._12_4_;
              bVar41 = (bool)(bVar29 >> 4 & 1);
              local_5a40._16_4_ = (uint)bVar41 * auVar44._16_4_ | (uint)!bVar41 * local_5a40._16_4_;
              bVar41 = (bool)(bVar29 >> 5 & 1);
              local_5a40._20_4_ = (uint)bVar41 * auVar44._20_4_ | (uint)!bVar41 * local_5a40._20_4_;
              bVar41 = (bool)(bVar29 >> 6 & 1);
              local_5a40._24_4_ = (uint)bVar41 * auVar44._24_4_ | (uint)!bVar41 * local_5a40._24_4_;
              local_5a40._28_4_ =
                   (uint)(bVar29 >> 7) * auVar44._28_4_ |
                   (uint)!(bool)(bVar29 >> 7) * local_5a40._28_4_;
              iVar30 = 2;
            }
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar83 = ZEXT3264(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar84 = ZEXT3264(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar85 = ZEXT3264(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar86 = ZEXT3264(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar87 = ZEXT3264(auVar44);
            uVar42 = uVar42 & 0xffffffff;
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar88 = ZEXT3264(auVar44);
            auVar81 = ZEXT3264(CONCAT428(0x3f800003,
                                         CONCAT424(0x3f800003,
                                                   CONCAT420(0x3f800003,
                                                             CONCAT416(0x3f800003,
                                                                       CONCAT412(0x3f800003,
                                                                                 CONCAT48(0x3f800003
                                                                                          ,
                                                  0x3f8000033f800003)))))));
            ray = local_5cb0;
          }
          auVar82 = ZEXT3264(auVar43);
          uVar39 = local_5c88;
          if ((uint)local_5c88 < (uint)POPCOUNT(uVar36)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00874261;
                uVar19 = vcmpps_avx512vl(auVar82._0_32_,local_5a40,9);
                if ((char)uVar19 == '\0') goto LAB_00874272;
                local_5c58 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar28 = bVar29;
                if (local_5c58 == 0) goto LAB_00874233;
                bVar28 = ~bVar29;
                lVar38 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                uVar39 = 0;
                goto LAB_00873b07;
              }
              auVar82 = ZEXT3264(auVar87._0_32_);
              uVar37 = 0;
              uVar31 = 8;
              do {
                uVar34 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar37 * 8);
                if (uVar34 != 8) {
                  uVar36 = *(undefined4 *)(root.ptr + 0x40 + uVar37 * 4);
                  auVar68._4_4_ = uVar36;
                  auVar68._0_4_ = uVar36;
                  auVar68._8_4_ = uVar36;
                  auVar68._12_4_ = uVar36;
                  auVar68._16_4_ = uVar36;
                  auVar68._20_4_ = uVar36;
                  auVar68._24_4_ = uVar36;
                  auVar68._28_4_ = uVar36;
                  auVar24._8_8_ = local_5be0._8_8_;
                  auVar24._0_8_ = local_5be0._0_8_;
                  auVar24._16_8_ = local_5be0._16_8_;
                  auVar24._24_8_ = local_5be0._24_8_;
                  auVar25._8_8_ = local_5be0._40_8_;
                  auVar25._0_8_ = local_5be0._32_8_;
                  auVar25._16_8_ = local_5be0._48_8_;
                  auVar25._24_8_ = local_5be0._56_8_;
                  auVar26._8_8_ = local_5be0._72_8_;
                  auVar26._0_8_ = local_5be0._64_8_;
                  auVar26._16_8_ = local_5be0._80_8_;
                  auVar26._24_8_ = local_5be0._88_8_;
                  auVar43 = vsubps_avx(auVar68,auVar24);
                  auVar78._0_4_ = (float)local_5b20._0_4_ * auVar43._0_4_;
                  auVar78._4_4_ = (float)local_5b20._4_4_ * auVar43._4_4_;
                  auVar78._8_4_ = fStack_5b18 * auVar43._8_4_;
                  auVar78._12_4_ = fStack_5b14 * auVar43._12_4_;
                  auVar78._16_4_ = fStack_5b10 * auVar43._16_4_;
                  auVar78._20_4_ = fStack_5b0c * auVar43._20_4_;
                  auVar78._28_36_ = auVar77._28_36_;
                  auVar78._24_4_ = fStack_5b08 * auVar43._24_4_;
                  auVar46 = auVar78._0_32_;
                  auVar77 = ZEXT3264(auVar46);
                  uVar36 = *(undefined4 *)(root.ptr + 0x80 + uVar37 * 4);
                  auVar69._4_4_ = uVar36;
                  auVar69._0_4_ = uVar36;
                  auVar69._8_4_ = uVar36;
                  auVar69._12_4_ = uVar36;
                  auVar69._16_4_ = uVar36;
                  auVar69._20_4_ = uVar36;
                  auVar69._24_4_ = uVar36;
                  auVar69._28_4_ = uVar36;
                  auVar43 = vsubps_avx(auVar69,auVar25);
                  auVar79._0_4_ = (float)local_5b00._0_4_ * auVar43._0_4_;
                  auVar79._4_4_ = (float)local_5b00._4_4_ * auVar43._4_4_;
                  auVar79._8_4_ = fStack_5af8 * auVar43._8_4_;
                  auVar79._12_4_ = fStack_5af4 * auVar43._12_4_;
                  auVar79._16_4_ = fStack_5af0 * auVar43._16_4_;
                  auVar79._20_4_ = fStack_5aec * auVar43._20_4_;
                  auVar79._28_36_ = in_ZMM7._28_36_;
                  auVar79._24_4_ = fStack_5ae8 * auVar43._24_4_;
                  auVar47 = auVar79._0_32_;
                  in_ZMM7 = ZEXT3264(auVar47);
                  uVar36 = *(undefined4 *)(root.ptr + 0xc0 + uVar37 * 4);
                  auVar70._4_4_ = uVar36;
                  auVar70._0_4_ = uVar36;
                  auVar70._8_4_ = uVar36;
                  auVar70._12_4_ = uVar36;
                  auVar70._16_4_ = uVar36;
                  auVar70._20_4_ = uVar36;
                  auVar70._24_4_ = uVar36;
                  auVar70._28_4_ = uVar36;
                  auVar43 = vsubps_avx(auVar70,auVar26);
                  auVar80._0_4_ = (float)local_5ae0._0_4_ * auVar43._0_4_;
                  auVar80._4_4_ = (float)local_5ae0._4_4_ * auVar43._4_4_;
                  auVar80._8_4_ = fStack_5ad8 * auVar43._8_4_;
                  auVar80._12_4_ = fStack_5ad4 * auVar43._12_4_;
                  auVar80._16_4_ = fStack_5ad0 * auVar43._16_4_;
                  auVar80._20_4_ = fStack_5acc * auVar43._20_4_;
                  auVar80._28_36_ = in_ZMM9._28_36_;
                  auVar80._24_4_ = fStack_5ac8 * auVar43._24_4_;
                  auVar76 = auVar80._0_32_;
                  in_ZMM9 = ZEXT3264(auVar76);
                  uVar36 = *(undefined4 *)(root.ptr + 0x60 + uVar37 * 4);
                  auVar71._4_4_ = uVar36;
                  auVar71._0_4_ = uVar36;
                  auVar71._8_4_ = uVar36;
                  auVar71._12_4_ = uVar36;
                  auVar71._16_4_ = uVar36;
                  auVar71._20_4_ = uVar36;
                  auVar71._24_4_ = uVar36;
                  auVar71._28_4_ = uVar36;
                  auVar43 = vsubps_avx(auVar71,auVar24);
                  auVar63._4_4_ = (float)local_5b20._4_4_ * auVar43._4_4_;
                  auVar63._0_4_ = (float)local_5b20._0_4_ * auVar43._0_4_;
                  auVar63._8_4_ = fStack_5b18 * auVar43._8_4_;
                  auVar63._12_4_ = fStack_5b14 * auVar43._12_4_;
                  auVar63._16_4_ = fStack_5b10 * auVar43._16_4_;
                  auVar63._20_4_ = fStack_5b0c * auVar43._20_4_;
                  auVar63._24_4_ = fStack_5b08 * auVar43._24_4_;
                  auVar63._28_4_ = (int)((ulong)local_5be0._24_8_ >> 0x20);
                  uVar36 = *(undefined4 *)(root.ptr + 0xa0 + uVar37 * 4);
                  auVar72._4_4_ = uVar36;
                  auVar72._0_4_ = uVar36;
                  auVar72._8_4_ = uVar36;
                  auVar72._12_4_ = uVar36;
                  auVar72._16_4_ = uVar36;
                  auVar72._20_4_ = uVar36;
                  auVar72._24_4_ = uVar36;
                  auVar72._28_4_ = uVar36;
                  auVar43 = vsubps_avx(auVar72,auVar25);
                  auVar65._4_4_ = (float)local_5b00._4_4_ * auVar43._4_4_;
                  auVar65._0_4_ = (float)local_5b00._0_4_ * auVar43._0_4_;
                  auVar65._8_4_ = fStack_5af8 * auVar43._8_4_;
                  auVar65._12_4_ = fStack_5af4 * auVar43._12_4_;
                  auVar65._16_4_ = fStack_5af0 * auVar43._16_4_;
                  auVar65._20_4_ = fStack_5aec * auVar43._20_4_;
                  auVar65._24_4_ = fStack_5ae8 * auVar43._24_4_;
                  auVar65._28_4_ = (int)((ulong)local_5be0._56_8_ >> 0x20);
                  uVar36 = *(undefined4 *)(root.ptr + 0xe0 + uVar37 * 4);
                  auVar73._4_4_ = uVar36;
                  auVar73._0_4_ = uVar36;
                  auVar73._8_4_ = uVar36;
                  auVar73._12_4_ = uVar36;
                  auVar73._16_4_ = uVar36;
                  auVar73._20_4_ = uVar36;
                  auVar73._24_4_ = uVar36;
                  auVar73._28_4_ = uVar36;
                  auVar43 = vsubps_avx(auVar73,auVar26);
                  auVar66._4_4_ = (float)local_5ae0._4_4_ * auVar43._4_4_;
                  auVar66._0_4_ = (float)local_5ae0._0_4_ * auVar43._0_4_;
                  auVar66._8_4_ = fStack_5ad8 * auVar43._8_4_;
                  auVar66._12_4_ = fStack_5ad4 * auVar43._12_4_;
                  auVar66._16_4_ = fStack_5ad0 * auVar43._16_4_;
                  auVar66._20_4_ = fStack_5acc * auVar43._20_4_;
                  auVar66._24_4_ = fStack_5ac8 * auVar43._24_4_;
                  auVar66._28_4_ = (int)((ulong)local_5be0._88_8_ >> 0x20);
                  auVar43 = vminps_avx(auVar46,auVar63);
                  auVar44 = vminps_avx(auVar47,auVar65);
                  auVar43 = vmaxps_avx(auVar43,auVar44);
                  auVar44 = vminps_avx(auVar76,auVar66);
                  auVar43 = vmaxps_avx(auVar43,auVar44);
                  auVar45 = vmulps_avx512vl(auVar43,auVar88._0_32_);
                  auVar43 = vmaxps_avx(auVar46,auVar63);
                  auVar44 = vmaxps_avx(auVar47,auVar65);
                  auVar44 = vminps_avx(auVar43,auVar44);
                  auVar43 = vmaxps_avx(auVar76,auVar66);
                  auVar43 = vminps_avx(auVar44,auVar43);
                  auVar67._4_4_ = auVar81._4_4_ * auVar43._4_4_;
                  auVar67._0_4_ = auVar81._0_4_ * auVar43._0_4_;
                  auVar67._8_4_ = auVar81._8_4_ * auVar43._8_4_;
                  auVar67._12_4_ = auVar81._12_4_ * auVar43._12_4_;
                  auVar67._16_4_ = auVar81._16_4_ * auVar43._16_4_;
                  auVar67._20_4_ = auVar81._20_4_ * auVar43._20_4_;
                  auVar67._24_4_ = auVar81._24_4_ * auVar43._24_4_;
                  auVar67._28_4_ = auVar43._28_4_;
                  auVar43 = vmaxps_avx(auVar45,local_5a60);
                  auVar44 = vminps_avx(auVar67,local_5a40);
                  uVar18 = vcmpps_avx512vl(auVar43,auVar44,2);
                  if ((byte)uVar18 != 0) {
                    auVar43 = vblendmps_avx512vl(auVar87._0_32_,auVar45);
                    bVar41 = (bool)((byte)uVar18 & 1);
                    bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
                    bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
                    bVar9 = (bool)((byte)(uVar18 >> 6) & 1);
                    bVar10 = SUB81(uVar18 >> 7,0);
                    if (uVar31 != 8) {
                      *puVar40 = uVar31;
                      puVar40 = puVar40 + 1;
                      *pauVar33 = auVar82._0_32_;
                      pauVar33 = pauVar33 + 1;
                    }
                    auVar82 = ZEXT3264(CONCAT428((uint)bVar10 * auVar43._28_4_ |
                                                 (uint)!bVar10 * auVar45._28_4_,
                                                 CONCAT424((uint)bVar9 * auVar43._24_4_ |
                                                           (uint)!bVar9 * auVar45._24_4_,
                                                           CONCAT420((uint)bVar8 * auVar43._20_4_ |
                                                                     (uint)!bVar8 * auVar45._20_4_,
                                                                     CONCAT416((uint)bVar7 *
                                                                               auVar43._16_4_ |
                                                                               (uint)!bVar7 *
                                                                               auVar45._16_4_,
                                                                               CONCAT412((uint)bVar6
                                                                                         * auVar43.
                                                  _12_4_ | (uint)!bVar6 * auVar45._12_4_,
                                                  CONCAT48((uint)bVar5 * auVar43._8_4_ |
                                                           (uint)!bVar5 * auVar45._8_4_,
                                                           CONCAT44((uint)bVar4 * auVar43._4_4_ |
                                                                    (uint)!bVar4 * auVar45._4_4_,
                                                                    (uint)bVar41 * auVar43._0_4_ |
                                                                    (uint)!bVar41 * auVar45._0_4_)))
                                                  )))));
                    uVar31 = uVar34;
                  }
                }
              } while ((uVar34 != 8) && (bVar41 = uVar37 < 7, uVar37 = uVar37 + 1, bVar41));
              iVar30 = 0;
              if (uVar31 == 8) {
LAB_00873ab7:
                bVar41 = false;
                iVar30 = 4;
              }
              else {
                uVar19 = vcmpps_avx512vl(auVar82._0_32_,local_5a40,9);
                bVar41 = true;
                if ((uint)POPCOUNT((int)uVar19) <= (uint)local_5c88) {
                  *puVar40 = uVar31;
                  puVar40 = puVar40 + 1;
                  *pauVar33 = auVar82._0_32_;
                  pauVar33 = pauVar33 + 1;
                  goto LAB_00873ab7;
                }
              }
              root.ptr = uVar31;
            } while (bVar41);
          }
        }
        goto LAB_00874264;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar39 = uVar39 + 1;
    lVar38 = lVar38 + 0xb0;
    if (local_5c58 <= uVar39) break;
LAB_00873b07:
    local_5c80._0_8_ = uVar39;
    uVar37 = 0;
    bVar35 = bVar28;
    while (uVar31 = (ulong)*(uint *)(lVar38 + -0x10 + uVar37 * 4), uVar31 != 0xffffffff) {
      uVar36 = *(undefined4 *)(lVar38 + -0xa0 + uVar37 * 4);
      auVar74._4_4_ = uVar36;
      auVar74._0_4_ = uVar36;
      auVar74._8_4_ = uVar36;
      auVar74._12_4_ = uVar36;
      auVar74._16_4_ = uVar36;
      auVar74._20_4_ = uVar36;
      auVar74._24_4_ = uVar36;
      auVar74._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x90 + uVar37 * 4);
      auVar48._4_4_ = uVar36;
      auVar48._0_4_ = uVar36;
      auVar48._8_4_ = uVar36;
      auVar48._12_4_ = uVar36;
      auVar48._16_4_ = uVar36;
      auVar48._20_4_ = uVar36;
      auVar48._24_4_ = uVar36;
      auVar48._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x80 + uVar37 * 4);
      auVar49._4_4_ = uVar36;
      auVar49._0_4_ = uVar36;
      auVar49._8_4_ = uVar36;
      auVar49._12_4_ = uVar36;
      auVar49._16_4_ = uVar36;
      auVar49._20_4_ = uVar36;
      auVar49._24_4_ = uVar36;
      auVar49._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x70 + uVar37 * 4);
      auVar50._4_4_ = uVar36;
      auVar50._0_4_ = uVar36;
      auVar50._8_4_ = uVar36;
      auVar50._12_4_ = uVar36;
      auVar50._16_4_ = uVar36;
      auVar50._20_4_ = uVar36;
      auVar50._24_4_ = uVar36;
      auVar50._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x60 + uVar37 * 4);
      auVar51._4_4_ = uVar36;
      auVar51._0_4_ = uVar36;
      auVar51._8_4_ = uVar36;
      auVar51._12_4_ = uVar36;
      auVar51._16_4_ = uVar36;
      auVar51._20_4_ = uVar36;
      auVar51._24_4_ = uVar36;
      auVar51._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x50 + uVar37 * 4);
      auVar52._4_4_ = uVar36;
      auVar52._0_4_ = uVar36;
      auVar52._8_4_ = uVar36;
      auVar52._12_4_ = uVar36;
      auVar52._16_4_ = uVar36;
      auVar52._20_4_ = uVar36;
      auVar52._24_4_ = uVar36;
      auVar52._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x40 + uVar37 * 4);
      auVar53._4_4_ = uVar36;
      auVar53._0_4_ = uVar36;
      auVar53._8_4_ = uVar36;
      auVar53._12_4_ = uVar36;
      auVar53._16_4_ = uVar36;
      auVar53._20_4_ = uVar36;
      auVar53._24_4_ = uVar36;
      auVar53._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x30 + uVar37 * 4);
      auVar54._4_4_ = uVar36;
      auVar54._0_4_ = uVar36;
      auVar54._8_4_ = uVar36;
      auVar54._12_4_ = uVar36;
      auVar54._16_4_ = uVar36;
      auVar54._20_4_ = uVar36;
      auVar54._24_4_ = uVar36;
      auVar54._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar38 + -0x20 + uVar37 * 4);
      auVar55._4_4_ = uVar36;
      auVar55._0_4_ = uVar36;
      auVar55._8_4_ = uVar36;
      auVar55._12_4_ = uVar36;
      auVar55._16_4_ = uVar36;
      auVar55._20_4_ = uVar36;
      auVar55._24_4_ = uVar36;
      auVar55._28_4_ = uVar36;
      auVar43 = *(undefined1 (*) [32])ray;
      auVar44 = *(undefined1 (*) [32])(ray + 0x20);
      auVar45 = *(undefined1 (*) [32])(ray + 0x40);
      auVar46 = *(undefined1 (*) [32])(ray + 0x80);
      auVar77 = ZEXT3264(auVar46);
      auVar47 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar76 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar74 = vsubps_avx(auVar74,auVar43);
      auVar48 = vsubps_avx512vl(auVar48,auVar44);
      auVar49 = vsubps_avx512vl(auVar49,auVar45);
      in_ZMM7 = ZEXT3264(auVar49);
      auVar50 = vsubps_avx512vl(auVar50,auVar43);
      auVar51 = vsubps_avx512vl(auVar51,auVar44);
      auVar52 = vsubps_avx512vl(auVar52,auVar45);
      auVar43 = vsubps_avx512vl(auVar53,auVar43);
      auVar53 = vsubps_avx512vl(auVar54,auVar44);
      auVar54 = vsubps_avx512vl(auVar55,auVar45);
      auVar55 = vsubps_avx512vl(auVar43,auVar74);
      auVar56 = vsubps_avx512vl(auVar53,auVar48);
      auVar57 = vsubps_avx512vl(auVar54,auVar49);
      auVar58 = vsubps_avx512vl(auVar74,auVar50);
      auVar59 = vsubps_avx512vl(auVar48,auVar51);
      auVar60 = vsubps_avx512vl(auVar49,auVar52);
      auVar61 = vsubps_avx512vl(auVar50,auVar43);
      auVar62 = vsubps_avx512vl(auVar51,auVar53);
      auVar63 = vsubps_avx512vl(auVar52,auVar54);
      auVar45 = vaddps_avx512vl(auVar43,auVar74);
      auVar64 = vaddps_avx512vl(auVar53,auVar48);
      auVar44 = vaddps_avx512vl(auVar54,auVar49);
      auVar65 = vmulps_avx512vl(auVar64,auVar57);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar56,auVar44);
      auVar44 = vmulps_avx512vl(auVar44,auVar55);
      auVar66 = vfmsub231ps_avx512vl(auVar44,auVar57,auVar45);
      auVar44._4_4_ = auVar45._4_4_ * auVar56._4_4_;
      auVar44._0_4_ = auVar45._0_4_ * auVar56._0_4_;
      auVar44._8_4_ = auVar45._8_4_ * auVar56._8_4_;
      auVar44._12_4_ = auVar45._12_4_ * auVar56._12_4_;
      auVar44._16_4_ = auVar45._16_4_ * auVar56._16_4_;
      auVar44._20_4_ = auVar45._20_4_ * auVar56._20_4_;
      auVar44._24_4_ = auVar45._24_4_ * auVar56._24_4_;
      auVar44._28_4_ = auVar45._28_4_;
      auVar75 = vfmsub231ps_fma(auVar44,auVar55,auVar64);
      fVar11 = auVar76._0_4_;
      auVar64._0_4_ = auVar75._0_4_ * fVar11;
      fVar12 = auVar76._4_4_;
      auVar64._4_4_ = auVar75._4_4_ * fVar12;
      fVar13 = auVar76._8_4_;
      auVar64._8_4_ = auVar75._8_4_ * fVar13;
      fVar14 = auVar76._12_4_;
      auVar64._12_4_ = auVar75._12_4_ * fVar14;
      fVar15 = auVar76._16_4_;
      auVar64._16_4_ = fVar15 * 0.0;
      fVar16 = auVar76._20_4_;
      auVar64._20_4_ = fVar16 * 0.0;
      fVar17 = auVar76._24_4_;
      auVar64._24_4_ = fVar17 * 0.0;
      auVar64._28_4_ = 0;
      auVar44 = vfmadd231ps_avx512vl(auVar64,auVar47,auVar66);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar65);
      in_ZMM9 = ZEXT3264(auVar44);
      auVar45 = vaddps_avx512vl(auVar74,auVar50);
      auVar64 = vaddps_avx512vl(auVar48,auVar51);
      auVar65 = vaddps_avx512vl(auVar49,auVar52);
      auVar66 = vmulps_avx512vl(auVar64,auVar60);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar59,auVar65);
      auVar65 = vmulps_avx512vl(auVar65,auVar58);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar60,auVar45);
      auVar45 = vmulps_avx512vl(auVar45,auVar59);
      auVar64 = vfmsub231ps_avx512vl(auVar45,auVar58,auVar64);
      auVar45._4_4_ = auVar64._4_4_ * fVar12;
      auVar45._0_4_ = auVar64._0_4_ * fVar11;
      auVar45._8_4_ = auVar64._8_4_ * fVar13;
      auVar45._12_4_ = auVar64._12_4_ * fVar14;
      auVar45._16_4_ = auVar64._16_4_ * fVar15;
      auVar45._20_4_ = auVar64._20_4_ * fVar16;
      auVar45._24_4_ = auVar64._24_4_ * fVar17;
      auVar45._28_4_ = auVar64._28_4_;
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar47,auVar65);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar46,auVar66);
      auVar43 = vaddps_avx512vl(auVar50,auVar43);
      auVar50 = vaddps_avx512vl(auVar51,auVar53);
      auVar51 = vaddps_avx512vl(auVar52,auVar54);
      auVar52 = vmulps_avx512vl(auVar50,auVar63);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar62,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar61);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar63,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar62);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar61,auVar50);
      auVar43 = vmulps_avx512vl(auVar43,auVar76);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar51);
      auVar50 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar52);
      auVar43 = vaddps_avx512vl(auVar44,auVar45);
      auVar51 = vaddps_avx512vl(auVar50,auVar43);
      auVar54 = auVar83._0_32_;
      vandps_avx512vl(auVar51,auVar54);
      auVar43._8_4_ = 0x34000000;
      auVar43._0_8_ = 0x3400000034000000;
      auVar43._12_4_ = 0x34000000;
      auVar43._16_4_ = 0x34000000;
      auVar43._20_4_ = 0x34000000;
      auVar43._24_4_ = 0x34000000;
      auVar43._28_4_ = 0x34000000;
      auVar52 = vmulps_avx512vl(auVar51,auVar43);
      auVar43 = vminps_avx512vl(auVar44,auVar45);
      auVar43 = vminps_avx512vl(auVar43,auVar50);
      auVar53 = vxorps_avx512vl(auVar52,auVar64);
      uVar19 = vcmpps_avx512vl(auVar43,auVar53,5);
      auVar43 = vmaxps_avx512vl(auVar44,auVar45);
      auVar43 = vmaxps_avx512vl(auVar43,auVar50);
      uVar20 = vcmpps_avx512vl(auVar43,auVar52,2);
      bVar32 = ((byte)uVar19 | (byte)uVar20) & bVar35;
      local_5cb8 = CONCAT71(local_5cb8._1_7_,bVar35);
      auVar50 = auVar85._0_32_;
      if (bVar32 != 0) {
        auVar43 = vmulps_avx512vl(auVar59,auVar57);
        auVar52 = vmulps_avx512vl(auVar55,auVar60);
        auVar53 = vmulps_avx512vl(auVar58,auVar56);
        auVar65 = vmulps_avx512vl(auVar62,auVar60);
        auVar66 = vmulps_avx512vl(auVar58,auVar63);
        auVar67 = vmulps_avx512vl(auVar61,auVar59);
        auVar56 = vfmsub213ps_avx512vl(auVar56,auVar60,auVar43);
        auVar57 = vfmsub213ps_avx512vl(auVar57,auVar58,auVar52);
        auVar55 = vfmsub213ps_avx512vl(auVar55,auVar59,auVar53);
        auVar59 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar65);
        auVar60 = vfmsub213ps_avx512vl(auVar61,auVar60,auVar66);
        auVar58 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar67);
        vandps_avx512vl(auVar43,auVar54);
        vandps_avx512vl(auVar65,auVar54);
        uVar34 = vcmpps_avx512vl(auVar58,auVar58,1);
        vandps_avx512vl(auVar52,auVar54);
        vandps_avx512vl(auVar66,auVar54);
        uVar18 = vcmpps_avx512vl(auVar58,auVar58,1);
        vandps_avx512vl(auVar53,auVar54);
        vandps_avx512vl(auVar67,auVar54);
        uVar21 = vcmpps_avx512vl(auVar58,auVar58,1);
        bVar41 = (bool)((byte)uVar34 & 1);
        auVar61._0_4_ = (uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar59._0_4_;
        bVar41 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar59._4_4_;
        bVar41 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar59._8_4_;
        bVar41 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar41 * auVar56._12_4_ | (uint)!bVar41 * auVar59._12_4_;
        bVar41 = (bool)((byte)(uVar34 >> 4) & 1);
        auVar61._16_4_ = (uint)bVar41 * auVar56._16_4_ | (uint)!bVar41 * auVar59._16_4_;
        bVar41 = (bool)((byte)(uVar34 >> 5) & 1);
        auVar61._20_4_ = (uint)bVar41 * auVar56._20_4_ | (uint)!bVar41 * auVar59._20_4_;
        bVar41 = (bool)((byte)(uVar34 >> 6) & 1);
        auVar61._24_4_ = (uint)bVar41 * auVar56._24_4_ | (uint)!bVar41 * auVar59._24_4_;
        bVar41 = SUB81(uVar34 >> 7,0);
        auVar61._28_4_ = (uint)bVar41 * auVar56._28_4_ | (uint)!bVar41 * auVar59._28_4_;
        bVar41 = (bool)((byte)uVar18 & 1);
        auVar59._0_4_ = (uint)bVar41 * auVar57._0_4_ | (uint)!bVar41 * auVar60._0_4_;
        bVar41 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar41 * auVar57._4_4_ | (uint)!bVar41 * auVar60._4_4_;
        bVar41 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar41 * auVar57._8_4_ | (uint)!bVar41 * auVar60._8_4_;
        bVar41 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar41 * auVar57._12_4_ | (uint)!bVar41 * auVar60._12_4_;
        bVar41 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar41 * auVar57._16_4_ | (uint)!bVar41 * auVar60._16_4_;
        bVar41 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar41 * auVar57._20_4_ | (uint)!bVar41 * auVar60._20_4_;
        bVar41 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar41 * auVar57._24_4_ | (uint)!bVar41 * auVar60._24_4_;
        bVar41 = SUB81(uVar18 >> 7,0);
        auVar59._28_4_ = (uint)bVar41 * auVar57._28_4_ | (uint)!bVar41 * auVar60._28_4_;
        bVar41 = (bool)((byte)uVar21 & 1);
        auVar57._0_4_ = (float)((uint)bVar41 * auVar55._0_4_ | (uint)!bVar41 * auVar58._0_4_);
        bVar41 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar57._4_4_ = (float)((uint)bVar41 * auVar55._4_4_ | (uint)!bVar41 * auVar58._4_4_);
        bVar41 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar57._8_4_ = (float)((uint)bVar41 * auVar55._8_4_ | (uint)!bVar41 * auVar58._8_4_);
        bVar41 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar57._12_4_ = (float)((uint)bVar41 * auVar55._12_4_ | (uint)!bVar41 * auVar58._12_4_);
        bVar41 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar57._16_4_ = (float)((uint)bVar41 * auVar55._16_4_ | (uint)!bVar41 * auVar58._16_4_);
        bVar41 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar57._20_4_ = (float)((uint)bVar41 * auVar55._20_4_ | (uint)!bVar41 * auVar58._20_4_);
        bVar41 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar57._24_4_ = (float)((uint)bVar41 * auVar55._24_4_ | (uint)!bVar41 * auVar58._24_4_);
        bVar41 = SUB81(uVar21 >> 7,0);
        auVar57._28_4_ = (uint)bVar41 * auVar55._28_4_ | (uint)!bVar41 * auVar58._28_4_;
        auVar56._4_4_ = fVar12 * auVar57._4_4_;
        auVar56._0_4_ = fVar11 * auVar57._0_4_;
        auVar56._8_4_ = fVar13 * auVar57._8_4_;
        auVar56._12_4_ = fVar14 * auVar57._12_4_;
        auVar56._16_4_ = fVar15 * auVar57._16_4_;
        auVar56._20_4_ = fVar16 * auVar57._20_4_;
        auVar56._24_4_ = fVar17 * auVar57._24_4_;
        auVar56._28_4_ = auVar76._28_4_;
        auVar75 = vfmadd213ps_fma(auVar47,auVar59,auVar56);
        auVar75 = vfmadd213ps_fma(auVar46,auVar61,ZEXT1632(auVar75));
        auVar76 = ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                     CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                              CONCAT44(auVar75._4_4_ + auVar75._4_4_,
                                                       auVar75._0_4_ + auVar75._0_4_))));
        auVar77 = ZEXT3264(auVar76);
        auVar46._0_4_ = auVar49._0_4_ * auVar57._0_4_;
        auVar46._4_4_ = auVar49._4_4_ * auVar57._4_4_;
        auVar46._8_4_ = auVar49._8_4_ * auVar57._8_4_;
        auVar46._12_4_ = auVar49._12_4_ * auVar57._12_4_;
        auVar46._16_4_ = auVar49._16_4_ * auVar57._16_4_;
        auVar46._20_4_ = auVar49._20_4_ * auVar57._20_4_;
        auVar46._24_4_ = auVar49._24_4_ * auVar57._24_4_;
        auVar46._28_4_ = 0;
        auVar75 = vfmadd213ps_fma(auVar48,auVar59,auVar46);
        auVar23 = vfmadd213ps_fma(auVar74,auVar61,ZEXT1632(auVar75));
        auVar46 = vrcp14ps_avx512vl(auVar76);
        auVar47 = vxorps_avx512vl(auVar76,auVar64);
        auVar43 = vfnmadd213ps_avx512vl(auVar46,auVar76,auVar50);
        auVar75 = vfmadd132ps_fma(auVar43,auVar46,auVar46);
        in_ZMM7 = ZEXT1664(auVar75);
        auVar46 = ZEXT1632(CONCAT412((auVar23._12_4_ + auVar23._12_4_) * auVar75._12_4_,
                                     CONCAT48((auVar23._8_4_ + auVar23._8_4_) * auVar75._8_4_,
                                              CONCAT44((auVar23._4_4_ + auVar23._4_4_) *
                                                       auVar75._4_4_,
                                                       (auVar23._0_4_ + auVar23._0_4_) *
                                                       auVar75._0_4_))));
        uVar19 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar20 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar22 = vcmpps_avx512vl(auVar76,auVar47,4);
        bVar32 = bVar32 & (byte)uVar19 & (byte)uVar20 & (byte)uVar22;
        if (bVar32 != 0) {
          auVar43 = auVar51;
          local_5a20 = auVar57;
          local_5a00 = auVar59;
          local_59e0 = auVar61;
          local_59c0 = auVar46;
          local_59a0 = auVar51;
          _local_5980 = auVar45;
          _local_5960 = auVar44;
        }
      }
      auVar81 = ZEXT3264(CONCAT428(0x3f800003,
                                   CONCAT424(0x3f800003,
                                             CONCAT420(0x3f800003,
                                                       CONCAT416(0x3f800003,
                                                                 CONCAT412(0x3f800003,
                                                                           CONCAT48(0x3f800003,
                                                                                                                                                                        
                                                  0x3f8000033f800003)))))));
      pGVar2 = (local_5c98->scene->geometries).items[uVar31].ptr;
      uVar1 = pGVar2->mask;
      auVar47._4_4_ = uVar1;
      auVar47._0_4_ = uVar1;
      auVar47._8_4_ = uVar1;
      auVar47._12_4_ = uVar1;
      auVar47._16_4_ = uVar1;
      auVar47._20_4_ = uVar1;
      auVar47._24_4_ = uVar1;
      auVar47._28_4_ = uVar1;
      uVar19 = vptestmd_avx512vl(auVar47,*(undefined1 (*) [32])(ray + 0x120));
      bVar32 = (byte)uVar19 & bVar32;
      uVar31 = (ulong)bVar32;
      if (bVar32 != 0) {
        uVar34 = uVar42;
        if ((local_5c98->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar39 = local_5c80._0_8_;
        }
        else {
          vandps_avx512vl(local_59a0,auVar54);
          uVar39 = vcmpps_avx512vl(auVar43,auVar84._0_32_,5);
          auVar43 = vrcp14ps_avx512vl(local_59a0);
          auVar45 = vfnmadd213ps_avx512vl(auVar43,local_59a0,auVar50);
          auVar45 = vfmadd132ps_avx512vl(auVar45,auVar43,auVar43);
          fVar11 = (float)((uint)((byte)uVar39 & 1) * auVar45._0_4_);
          fVar17 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_);
          fVar16 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_);
          fVar15 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_);
          fVar14 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_);
          fVar13 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_);
          fVar12 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_);
          auVar76._4_4_ = fVar17 * (float)local_5960._4_4_;
          auVar76._0_4_ = fVar11 * (float)local_5960._0_4_;
          auVar76._8_4_ = fVar16 * fStack_5958;
          auVar76._12_4_ = fVar15 * fStack_5954;
          auVar76._16_4_ = fVar14 * fStack_5950;
          auVar76._20_4_ = fVar13 * fStack_594c;
          auVar76._24_4_ = fVar12 * fStack_5948;
          auVar76._28_4_ = auVar43._28_4_;
          local_58e0 = vminps_avx512vl(auVar76,auVar50);
          auVar58._4_4_ = fVar17 * (float)local_5980._4_4_;
          auVar58._0_4_ = fVar11 * (float)local_5980._0_4_;
          auVar58._8_4_ = fVar16 * fStack_5978;
          auVar58._12_4_ = fVar15 * fStack_5974;
          auVar58._16_4_ = fVar14 * fStack_5970;
          auVar58._20_4_ = fVar13 * fStack_596c;
          auVar58._24_4_ = fVar12 * fStack_5968;
          auVar58._28_4_ = (uint)(byte)(uVar39 >> 7) * auVar45._28_4_;
          local_58c0 = vminps_avx512vl(auVar58,auVar50);
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_59e0._0_8_;
          uStack_5938 = local_59e0._8_8_;
          uStack_5930 = local_59e0._16_8_;
          uStack_5928 = local_59e0._24_8_;
          local_5920 = local_5a00._0_8_;
          uStack_5918 = local_5a00._8_8_;
          uStack_5910 = local_5a00._16_8_;
          uStack_5908 = local_5a00._24_8_;
          local_5900 = local_5a20._0_8_;
          uStack_58f8 = local_5a20._8_8_;
          uStack_58f0 = local_5a20._16_8_;
          uStack_58e8 = local_5a20._24_8_;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = local_5c98->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = local_5c98->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar43 = vblendmps_avx512vl(local_5c00,local_59c0);
          bVar41 = (bool)(bVar32 >> 1 & 1);
          bVar4 = (bool)(bVar32 >> 2 & 1);
          bVar5 = (bool)(bVar32 >> 3 & 1);
          bVar6 = (bool)(bVar32 >> 4 & 1);
          bVar7 = (bool)(bVar32 >> 5 & 1);
          bVar8 = (bool)(bVar32 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar32 & 1) * auVar43._0_4_ | !(bool)(bVar32 & 1) * uStack_583c;
          *(uint *)(ray + 0x104) = (uint)bVar41 * auVar43._4_4_ | !bVar41 * uStack_583c;
          *(uint *)(ray + 0x108) = (uint)bVar4 * auVar43._8_4_ | !bVar4 * uStack_583c;
          *(uint *)(ray + 0x10c) = (uint)bVar5 * auVar43._12_4_ | !bVar5 * uStack_583c;
          *(uint *)(ray + 0x110) = (uint)bVar6 * auVar43._16_4_ | !bVar6 * uStack_583c;
          *(uint *)(ray + 0x114) = (uint)bVar7 * auVar43._20_4_ | !bVar7 * uStack_583c;
          *(uint *)(ray + 0x118) = (uint)bVar8 * auVar43._24_4_ | !bVar8 * uStack_583c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar32 >> 7) * auVar43._28_4_ | !(bool)(bVar32 >> 7) * uStack_583c;
          local_5c20 = vpmovm2d_avx512vl(uVar31);
          local_5c50.valid = (int *)local_5c20;
          local_5c50.geometryUserPtr = pGVar2->userPtr;
          local_5c50.context = local_5c98->user;
          local_5c50.hit = (RTCHitN *)&local_5940;
          local_5c50.N = 8;
          local_5c50.ray = (RTCRayN *)ray;
          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar77 = ZEXT1664(auVar77._0_16_);
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            in_ZMM9 = ZEXT1664(auVar44._0_16_);
            local_5cb0 = ray;
            (*pGVar2->occlusionFilterN)(&local_5c50);
            auVar81 = ZEXT3264(CONCAT428(0x3f800003,
                                         CONCAT424(0x3f800003,
                                                   CONCAT420(0x3f800003,
                                                             CONCAT416(0x3f800003,
                                                                       CONCAT412(0x3f800003,
                                                                                 CONCAT48(0x3f800003
                                                                                          ,
                                                  0x3f8000033f800003)))))));
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar88 = ZEXT3264(auVar43);
            uVar34 = uVar42 & 0xffffffff;
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar87 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar86 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar85 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar84 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar83 = ZEXT3264(auVar43);
            ray = local_5cb0;
          }
          uVar31 = vptestmd_avx512vl(local_5c20,local_5c20);
          uVar39 = local_5c80._0_8_;
          if ((char)uVar31 != '\0') {
            p_Var3 = local_5c98->args->filter;
            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
               (((local_5c98->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
              auVar77 = ZEXT1664(auVar77._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              (*p_Var3)(&local_5c50);
              auVar81 = ZEXT3264(CONCAT428(0x3f800003,
                                           CONCAT424(0x3f800003,
                                                     CONCAT420(0x3f800003,
                                                               CONCAT416(0x3f800003,
                                                                         CONCAT412(0x3f800003,
                                                                                   CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar88 = ZEXT3264(auVar43);
              uVar34 = uVar42 & 0xffffffff;
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar87 = ZEXT3264(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar86 = ZEXT3264(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar85 = ZEXT3264(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar84 = ZEXT3264(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar83 = ZEXT3264(auVar43);
            }
            uVar31 = vptestmd_avx512vl(local_5c20,local_5c20);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar41 = (bool)((byte)uVar31 & 1);
            auVar60._0_4_ =
                 (uint)bVar41 * auVar43._0_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x100);
            bVar41 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar60._4_4_ =
                 (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x104);
            bVar41 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar60._8_4_ =
                 (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x108);
            bVar41 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar60._12_4_ =
                 (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x10c);
            bVar41 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar60._16_4_ =
                 (uint)bVar41 * auVar43._16_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x110);
            bVar41 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar60._20_4_ =
                 (uint)bVar41 * auVar43._20_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x114);
            bVar41 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar60._24_4_ =
                 (uint)bVar41 * auVar43._24_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x118);
            bVar41 = SUB81(uVar31 >> 7,0);
            auVar60._28_4_ =
                 (uint)bVar41 * auVar43._28_4_ | (uint)!bVar41 * *(int *)(local_5c50.ray + 0x11c);
            *(undefined1 (*) [32])(local_5c50.ray + 0x100) = auVar60;
            uVar39 = local_5c80._0_8_;
          }
          bVar41 = (bool)((byte)uVar31 & 1);
          auVar62._0_4_ = (uint)bVar41 * *(int *)local_5c90 | (uint)!bVar41 * local_5c00._0_4_;
          bVar41 = (bool)((byte)(uVar31 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar41 * *(int *)(local_5c90 + 4) | (uint)!bVar41 * local_5c00._4_4_
          ;
          bVar41 = (bool)((byte)(uVar31 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar41 * *(int *)(local_5c90 + 8) | (uint)!bVar41 * local_5c00._8_4_
          ;
          bVar41 = (bool)((byte)(uVar31 >> 3) & 1);
          auVar62._12_4_ =
               (uint)bVar41 * *(int *)(local_5c90 + 0xc) | (uint)!bVar41 * local_5c00._12_4_;
          bVar41 = (bool)((byte)(uVar31 >> 4) & 1);
          auVar62._16_4_ =
               (uint)bVar41 * *(int *)(local_5c90 + 0x10) | (uint)!bVar41 * local_5c00._16_4_;
          bVar41 = (bool)((byte)(uVar31 >> 5) & 1);
          auVar62._20_4_ =
               (uint)bVar41 * *(int *)(local_5c90 + 0x14) | (uint)!bVar41 * local_5c00._20_4_;
          bVar41 = (bool)((byte)(uVar31 >> 6) & 1);
          auVar62._24_4_ =
               (uint)bVar41 * *(int *)(local_5c90 + 0x18) | (uint)!bVar41 * local_5c00._24_4_;
          bVar41 = SUB81(uVar31 >> 7,0);
          auVar62._28_4_ =
               (uint)bVar41 * *(int *)(local_5c90 + 0x1c) | (uint)!bVar41 * local_5c00._28_4_;
          *(undefined1 (*) [32])local_5c90 = auVar62;
        }
        bVar35 = (byte)local_5cb8 & ~(byte)uVar31;
        uVar42 = uVar34;
      }
      if ((bVar35 == 0) || (bVar41 = 2 < uVar37, uVar37 = uVar37 + 1, bVar41)) break;
    }
    bVar28 = bVar28 & bVar35;
    if (bVar28 == 0) break;
  }
  bVar28 = ~bVar28;
LAB_00874233:
  bVar29 = bVar29 | bVar28;
  uVar39 = local_5c88;
  if (bVar29 == 0xff) {
LAB_00874261:
    iVar30 = 3;
  }
  else {
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_5a40._0_4_ =
         (uint)(bVar29 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar29 & 1) * local_5a40._0_4_;
    bVar41 = (bool)(bVar29 >> 1 & 1);
    local_5a40._4_4_ = (uint)bVar41 * auVar43._4_4_ | (uint)!bVar41 * local_5a40._4_4_;
    bVar41 = (bool)(bVar29 >> 2 & 1);
    local_5a40._8_4_ = (uint)bVar41 * auVar43._8_4_ | (uint)!bVar41 * local_5a40._8_4_;
    bVar41 = (bool)(bVar29 >> 3 & 1);
    local_5a40._12_4_ = (uint)bVar41 * auVar43._12_4_ | (uint)!bVar41 * local_5a40._12_4_;
    bVar41 = (bool)(bVar29 >> 4 & 1);
    local_5a40._16_4_ = (uint)bVar41 * auVar43._16_4_ | (uint)!bVar41 * local_5a40._16_4_;
    bVar41 = (bool)(bVar29 >> 5 & 1);
    local_5a40._20_4_ = (uint)bVar41 * auVar43._20_4_ | (uint)!bVar41 * local_5a40._20_4_;
    bVar41 = (bool)(bVar29 >> 6 & 1);
    local_5a40._24_4_ = (uint)bVar41 * auVar43._24_4_ | (uint)!bVar41 * local_5a40._24_4_;
    local_5a40._28_4_ =
         (uint)(bVar29 >> 7) * auVar43._28_4_ | (uint)!(bool)(bVar29 >> 7) * local_5a40._28_4_;
    iVar30 = 0;
  }
LAB_00874264:
  if (iVar30 == 3) {
    bVar29 = bVar29 & (byte)uVar42;
    bVar41 = (bool)(bVar29 >> 1 & 1);
    bVar4 = (bool)(bVar29 >> 2 & 1);
    bVar5 = (bool)(bVar29 >> 3 & 1);
    bVar6 = (bool)(bVar29 >> 4 & 1);
    bVar7 = (bool)(bVar29 >> 5 & 1);
    bVar8 = (bool)(bVar29 >> 6 & 1);
    *(uint *)local_5c90 =
         (uint)(bVar29 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar29 & 1) * *(int *)local_5c90;
    *(uint *)(local_5c90 + 4) =
         (uint)bVar41 * auVar86._4_4_ | (uint)!bVar41 * *(int *)(local_5c90 + 4);
    *(uint *)(local_5c90 + 8) =
         (uint)bVar4 * auVar86._8_4_ | (uint)!bVar4 * *(int *)(local_5c90 + 8);
    *(uint *)(local_5c90 + 0xc) =
         (uint)bVar5 * auVar86._12_4_ | (uint)!bVar5 * *(int *)(local_5c90 + 0xc);
    *(uint *)(local_5c90 + 0x10) =
         (uint)bVar6 * auVar86._16_4_ | (uint)!bVar6 * *(int *)(local_5c90 + 0x10);
    *(uint *)(local_5c90 + 0x14) =
         (uint)bVar7 * auVar86._20_4_ | (uint)!bVar7 * *(int *)(local_5c90 + 0x14);
    *(uint *)(local_5c90 + 0x18) =
         (uint)bVar8 * auVar86._24_4_ | (uint)!bVar8 * *(int *)(local_5c90 + 0x18);
    *(uint *)(local_5c90 + 0x1c) =
         (uint)(bVar29 >> 7) * auVar86._28_4_ |
         (uint)!(bool)(bVar29 >> 7) * *(int *)(local_5c90 + 0x1c);
    return;
  }
  goto LAB_008738cb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }